

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_import(ptls_context_t *ctx,ptls_t **tls,ptls_iovec_t params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ptls_t *ppVar7;
  ptls_cipher_suite_t *ppVar8;
  ptls_key_schedule_t *ppVar9;
  long lVar10;
  ptls_cipher_suite_t **pppVar11;
  ulong uVar12;
  ushort uVar13;
  ulong unaff_RBP;
  ushort *puVar14;
  ushort uVar15;
  int iVar16;
  ushort *puVar17;
  ushort *puVar18;
  ushort *local_48;
  ushort *local_40;
  ptls_context_t *local_38;
  
  puVar18 = (ushort *)params.base;
  puVar17 = (ushort *)((long)puVar18 + params.len);
  *tls = (ptls_t *)0x0;
  iVar5 = 0x32;
  iVar16 = 6;
  local_48 = puVar18;
  if (params.len < 2) goto LAB_00110f1d;
  lVar10 = 0;
  unaff_RBP = 0;
  do {
    unaff_RBP = (ulong)*(byte *)((long)puVar18 + lVar10) | unaff_RBP << 8;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  puVar14 = puVar18 + 1;
  local_48 = puVar14;
  if (((ulong)((long)puVar17 - (long)puVar14) < unaff_RBP) || ((long)unaff_RBP < 2))
  goto LAB_00110f1d;
  local_48 = (ushort *)((long)puVar18 + 3);
  local_38 = ctx;
  ppVar7 = new_instance(ctx,(uint)(byte)puVar18[1]);
  *tls = ppVar7;
  if (ppVar7 == (ptls_t *)0x0) {
    iVar5 = 0x201;
    goto LAB_00110f1d;
  }
  puVar14 = (ushort *)((long)puVar14 + unaff_RBP);
  local_48 = puVar18 + 2;
  ppVar7->field_0x1e8 = ppVar7->field_0x1e8 & 0xfd | *(char *)((long)puVar18 + 3) * '\x02' & 2U;
  if ((long)puVar14 - (long)local_48 < 2) {
    iVar5 = 0x32;
    goto LAB_00110f1d;
  }
  uVar15 = puVar18[2] << 8 | puVar18[2] >> 8;
  local_48 = puVar18 + 3;
  if ((long)puVar14 - (long)local_48 < 2) {
    iVar5 = 0x32;
    goto LAB_00110f1d;
  }
  uVar13 = *local_48 << 8 | *local_48 >> 8;
  unaff_RBP = (ulong)uVar13;
  local_48 = puVar18 + 4;
  iVar5 = 0x32;
  if ((long)puVar14 - (long)local_48 < 0x20) goto LAB_00110f1d;
  ppVar7 = *tls;
  uVar1 = *(undefined8 *)local_48;
  uVar2 = *(undefined8 *)(puVar18 + 8);
  uVar3 = *(undefined8 *)(puVar18 + 0x10);
  *(undefined8 *)(ppVar7->client_random + 0x10) = *(undefined8 *)(puVar18 + 0xc);
  *(undefined8 *)(ppVar7->client_random + 0x18) = uVar3;
  *(undefined8 *)ppVar7->client_random = uVar1;
  *(undefined8 *)(ppVar7->client_random + 8) = uVar2;
  local_48 = puVar18 + 0x14;
  iVar5 = 0x32;
  iVar16 = 6;
  if (1 < (ulong)((long)puVar14 - (long)local_48)) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)local_48 + lVar10) | uVar12 << 8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    local_48 = puVar18 + 0x15;
    if (uVar12 <= (ulong)((long)puVar14 - (long)local_48)) {
      puVar18 = (ushort *)((long)local_48 + uVar12);
      if (uVar12 != 0) {
        local_40 = (ushort *)((long)local_48 + uVar12);
        iVar5 = ptls_set_server_name(*tls,(char *)local_48,uVar12);
        if (iVar5 != 0) goto LAB_00110c3f;
        local_48 = local_40;
        puVar18 = local_40;
      }
      iVar16 = 6;
      if (local_48 == puVar18) {
        iVar16 = 0;
      }
      iVar5 = 0x32;
      if (local_48 == puVar18) {
        iVar5 = 0;
      }
    }
  }
LAB_00110c3f:
  if (iVar16 != 0) goto LAB_00110f1d;
  iVar16 = 6;
  iVar6 = 0x32;
  if (1 < (ulong)((long)puVar14 - (long)local_48)) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)local_48 + lVar10) | uVar12 << 8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    local_48 = local_48 + 1;
    if (uVar12 <= (ulong)((long)puVar14 - (long)local_48)) {
      puVar18 = (ushort *)((long)local_48 + uVar12);
      if (uVar12 != 0) {
        local_40 = (ushort *)((long)local_48 + uVar12);
        iVar6 = ptls_set_negotiated_protocol(*tls,(char *)local_48,uVar12);
        if (iVar6 != 0) goto LAB_00110cdd;
        local_48 = local_40;
        iVar5 = 0;
        puVar18 = local_40;
      }
      iVar16 = 6;
      if (local_48 == puVar18) {
        iVar16 = 0;
      }
      iVar6 = 0x32;
      if (local_48 == puVar18) {
        iVar6 = iVar5;
      }
    }
  }
LAB_00110cdd:
  iVar5 = iVar6;
  if (iVar16 != 0) goto LAB_00110f1d;
  iVar5 = 0x32;
  iVar16 = 6;
  if (1 < (ulong)((long)puVar14 - (long)local_48)) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)*(byte *)((long)local_48 + lVar10) | uVar12 << 8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    local_48 = local_48 + 1;
    if (uVar12 <= (ulong)((long)puVar14 - (long)local_48)) {
      puVar18 = (ushort *)((long)local_48 + uVar12);
      if (uVar15 == 0x304) {
        pppVar11 = local_38->cipher_suites;
        if (pppVar11 == (ptls_cipher_suite_t **)0x0) {
          ppVar8 = (ptls_cipher_suite_t *)0x0;
        }
        else {
          ppVar8 = *pppVar11;
          while ((ppVar8 != (ptls_cipher_suite_t *)0x0 &&
                 (pppVar11 = pppVar11 + 1, ppVar8->id != uVar13))) {
            ppVar8 = *pppVar11;
          }
        }
        (*tls)->cipher_suite = ppVar8;
        ppVar8 = (*tls)->cipher_suite;
        if (ppVar8 == (ptls_cipher_suite_t *)0x0) {
LAB_00110e85:
          iVar5 = 0x28;
        }
        else {
          ppVar9 = key_schedule_new(ppVar8,(ptls_cipher_suite_t **)0x0,
                                    (uint)(((*tls)->ech).aead != (ptls_aead_context_t *)0x0));
          (*tls)->key_schedule = ppVar9;
          if (ppVar9 == (ptls_key_schedule_t *)0x0) {
            iVar5 = 0x201;
          }
          else {
            iVar5 = import_tls13_traffic_protection(*tls,1,(uint8_t **)&local_48,(uint8_t *)puVar18)
            ;
            if (iVar5 == 0) {
              iVar5 = import_tls13_traffic_protection
                                (*tls,0,(uint8_t **)&local_48,(uint8_t *)puVar18);
              goto LAB_00110e67;
            }
          }
        }
      }
      else {
        iVar5 = 0x2f;
        if (uVar15 == 0x303) {
          pppVar11 = local_38->tls12_cipher_suites;
          if (pppVar11 == (ptls_cipher_suite_t **)0x0) {
            ppVar8 = (ptls_cipher_suite_t *)0x0;
          }
          else {
            ppVar8 = *pppVar11;
            while ((ppVar8 != (ptls_cipher_suite_t *)0x0 &&
                   (pppVar11 = pppVar11 + 1, ppVar8->id != uVar13))) {
              ppVar8 = *pppVar11;
            }
          }
          (*tls)->cipher_suite = ppVar8;
          if ((*tls)->cipher_suite == (ptls_cipher_suite_t *)0x0) goto LAB_00110e85;
          iVar5 = import_tls12_traffic_protection(*tls,1,(uint8_t **)&local_48,(uint8_t *)puVar18);
          if (iVar5 == 0) {
            iVar5 = import_tls12_traffic_protection(*tls,0,(uint8_t **)&local_48,(uint8_t *)puVar18)
            ;
LAB_00110e67:
            if (iVar5 == 0) {
              iVar16 = 6;
              if (local_48 == puVar18) {
                iVar16 = 0;
              }
              iVar5 = 0x32;
              if (local_48 == puVar18) {
                iVar5 = 0;
              }
            }
          }
        }
      }
    }
  }
  if (iVar16 == 0) {
    iVar16 = 6;
    iVar6 = 0x32;
    if ((ulong)((long)puVar14 - (long)local_48) < 2) {
      bVar4 = false;
    }
    else {
      lVar10 = 0;
      uVar12 = 0;
      do {
        uVar12 = (ulong)*(byte *)((long)local_48 + lVar10) | uVar12 << 8;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 2);
      local_48 = local_48 + 1;
      bVar4 = false;
      if (uVar12 <= (ulong)((long)puVar14 - (long)local_48)) {
        local_48 = (ushort *)((long)local_48 + uVar12);
        bVar4 = true;
        iVar16 = 0;
        iVar6 = iVar5;
      }
    }
    iVar5 = iVar6;
    if (bVar4) {
      iVar16 = 6;
      if (local_48 == puVar14) {
        iVar16 = 0;
      }
      iVar5 = 0x32;
      if (local_48 == puVar14) {
        iVar5 = iVar6;
      }
    }
  }
LAB_00110f1d:
  iVar6 = iVar5;
  if (iVar16 != 6) {
    if (iVar16 != 0) {
      return (int)unaff_RBP;
    }
    iVar6 = 0x32;
    if (local_48 == puVar17) {
      (*tls)->state = ((byte)(*tls)->field_0x1e8 & 1) + PTLS_STATE_CLIENT_POST_HANDSHAKE;
      iVar6 = iVar5;
    }
  }
  if ((iVar6 != 0) && (*tls != (ptls_t *)0x0)) {
    ptls_free(*tls);
    *tls = (ptls_t *)0x0;
  }
  return iVar6;
}

Assistant:

int ptls_import(ptls_context_t *ctx, ptls_t **tls, ptls_iovec_t params)
{
    const uint8_t *src = params.base, *const end = src + params.len;
    uint16_t protocol_version, csid;
    int ret;

    *tls = NULL;

    /* TODO handle flags like psk_handshake, ech_handshake as we add support for TLS/1.3 import */
    ptls_decode_block(src, end, 2, {
        /* instantiate, based on the is_server flag */
        if (end - src < 2) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((*tls = new_instance(ctx, *src++)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        (*tls)->is_psk_handshake = *src++;
        /* determine protocol version and cipher suite */
        if ((ret = ptls_decode16(&protocol_version, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        /* other version-independent stuff */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        memcpy((*tls)->client_random, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_server_name(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_negotiated_protocol(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        /* version-dependent stuff */
        ptls_decode_open_block(src, end, 2, {
            switch (protocol_version) {
            case PTLS_PROTOCOL_VERSION_TLS12:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->tls12_cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if ((ret = import_tls12_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls12_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            case PTLS_PROTOCOL_VERSION_TLS13:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if (((*tls)->key_schedule = key_schedule_new((*tls)->cipher_suite, NULL, (*tls)->ech.aead != NULL)) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                if ((ret = import_tls13_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls13_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        /* extensions */
        ptls_decode_open_block(src, end, 2, {
            src = end; /* unused */
        });
    });

    (*tls)->state = ptls_is_server(*tls) ? PTLS_STATE_SERVER_POST_HANDSHAKE : PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    if (ret != 0) {
        if (*tls != NULL) {
            ptls_free(*tls);
            *tls = NULL;
        }
    }
    return ret;
}